

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_icdf<trng::rayleigh_dist<double>>(rayleigh_dist<double> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  reference pvVar2;
  reference pdVar3;
  int iVar4;
  undefined8 in_RDI;
  rayleigh_dist<double> *this;
  double extraout_XMM0_Qa;
  AssertionHandler catchAssertionHandler;
  result_type y;
  result_type x;
  double p;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range1;
  int i;
  vector<double,_std::allocator<double>_> p_values;
  double eps;
  undefined4 in_stack_fffffffffffffe68;
  Flags in_stack_fffffffffffffe6c;
  ExprLhs<const_double_&> in_stack_fffffffffffffe70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe80;
  vector<double,_std::allocator<double>_> *rhs;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe98;
  SourceLineInfo local_f8;
  StringRef local_e8;
  undefined1 local_d8 [72];
  AssertionHandler *local_90;
  rayleigh_dist<double> *local_88;
  double local_80;
  double *local_78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_70;
  vector<double,_std::allocator<double>_> *local_68;
  double *local_60;
  double *local_58;
  double local_50;
  double local_48;
  int local_40;
  undefined8 local_30;
  vector<double,_std::allocator<double>_> local_28;
  double local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = Catch::clara::std::numeric_limits<double>::epsilon();
  local_10 = local_10 * 256.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x35542b);
  local_30 = 0x3fe0000000000000;
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70.m_lhs,
             (value_type_conflict6 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  for (local_40 = 2; local_40 < 0x35; local_40 = local_40 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,0);
    local_48 = pow(*pvVar2,(double)local_40);
    local_48 = local_48 + 0.0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70.m_lhs,
               (value_type_conflict6 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
              );
    in_stack_fffffffffffffe98 = &local_28;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_stack_fffffffffffffe98,0);
    local_50 = pow(*pvVar2,(double)local_40);
    local_50 = 1.0 - local_50;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70.m_lhs,
               (value_type_conflict6 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
              );
  }
  rhs = &local_28;
  local_58 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_60 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_68 = &local_28;
  local_70._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)
                  CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_78 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffe70.m_lhs,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_70);
    local_80 = *pdVar3;
    this = (rayleigh_dist<double> *)
           trng::rayleigh_dist<double>::icdf
                     ((rayleigh_dist<double> *)in_stack_fffffffffffffe78._M_current,
                      (result_type_conflict2)in_stack_fffffffffffffe70.m_lhs);
    iVar4 = (int)local_8;
    local_88 = this;
    in_stack_fffffffffffffe80._M_current =
         (double *)trng::rayleigh_dist<double>::cdf(this,in_stack_fffffffffffffe80._M_current);
    local_90 = (AssertionHandler *)in_stack_fffffffffffffe80._M_current;
    Catch::clara::std::abs(iVar4);
    if (5.6843418860808015e-14 <= extraout_XMM0_Qa) {
      local_e8 = operator____catch_sr
                           ((char *)in_stack_fffffffffffffe70.m_lhs,
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      in_stack_fffffffffffffe78._M_current = (double *)&local_f8;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffffe78._M_current,
                 "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
                 ,0xa8);
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffe80._M_current,
                 (char *)in_stack_fffffffffffffe78._M_current);
      iVar4 = (int)local_d8;
      capturedExpression.m_size = (size_type)rhs;
      capturedExpression.m_start = (char *)this;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffe80._M_current,
                 (StringRef *)in_stack_fffffffffffffe78._M_current,
                 (SourceLineInfo *)in_stack_fffffffffffffe70.m_lhs,capturedExpression,
                 in_stack_fffffffffffffe6c);
      Catch::clara::std::abs(iVar4);
      in_stack_fffffffffffffe70 =
           Catch::Decomposer::operator<=
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                      (double *)0x35572d);
      Catch::ExprLhs<double_const&>::operator<
                ((ExprLhs<const_double_&> *)in_stack_fffffffffffffe98,(double *)rhs);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)in_stack_fffffffffffffe70.m_lhs,
                 (ITransientExpression *)
                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      Catch::BinaryExpr<const_double_&,_const_double_&>::~BinaryExpr
                ((BinaryExpr<const_double_&,_const_double_&> *)0x355775);
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffe70.m_lhs);
      Catch::AssertionHandler::~AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffffe70.m_lhs);
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_70);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80._M_current);
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}